

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O1

void __thiscall Triangle::prepare_coords(Triangle *this)

{
  undefined1 *v0;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *pfVar5;
  int i;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f norm;
  Vector3f v2;
  Vector3f v1;
  float local_b8;
  Vector3f local_a8;
  Vector3f local_9c;
  Vector3f local_90;
  Vector3f local_84;
  Matrix3f local_78;
  Matrix3f local_54;
  
  if (this->has_uv != false) {
    return;
  }
  Vector3f::Vector3f(&local_90,0.0);
  Vector3f::Vector3f(&local_9c,0.0);
  Vector3f::operator=(&this->o,&Vector3f::ZERO);
  v0 = &this->field_0x5c;
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x68);
  operator-((Vector3f *)v0,(Vector3f *)&this->field_0x74);
  Vector3f::cross((Vector3f *)&local_78,&local_84);
  Vector3f::normalized(&local_a8);
  fVar8 = Vector3f::dot((Vector3f *)v0,&local_a8);
  i = 0;
  pfVar5 = Vector3f::operator[](&local_a8,0);
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar6);
  pfVar5 = Vector3f::operator[](&local_a8,1);
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar7);
  local_b8 = auVar6._0_4_;
  if (auVar7._0_4_ < local_b8) {
    pfVar5 = Vector3f::operator[](&local_a8,0);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(ZEXT416((uint)*pfVar5),auVar9);
    pfVar5 = Vector3f::operator[](&local_a8,2);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar2);
    local_b8 = auVar6._0_4_;
    if (auVar7._0_4_ < local_b8) goto LAB_001c106b;
  }
  i = 1;
  pfVar5 = Vector3f::operator[](&local_a8,1);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(ZEXT416((uint)*pfVar5),auVar10);
  pfVar5 = Vector3f::operator[](&local_a8,0);
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar3);
  local_b8 = auVar6._0_4_;
  if (auVar7._0_4_ < local_b8) {
    pfVar5 = Vector3f::operator[](&local_a8,1);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(ZEXT416((uint)*pfVar5),auVar11);
    pfVar5 = Vector3f::operator[](&local_a8,2);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)*pfVar5),auVar4);
    local_b8 = auVar6._0_4_;
    if (auVar7._0_4_ < local_b8) goto LAB_001c106b;
  }
  i = 2;
LAB_001c106b:
  pfVar5 = Vector3f::operator[](&local_a8,i);
  fVar1 = *pfVar5;
  pfVar5 = Vector3f::operator[](&this->o,i);
  *pfVar5 = fVar8 / fVar1;
  createCoordinateSystem(&local_a8,&local_90,&local_9c);
  Matrix3f::Matrix3f(&local_78,&local_a8,&local_90,&local_9c,true);
  Matrix3f::inverse(&local_54,&local_78,(bool *)0x0,0.0);
  Matrix3f::operator=(&this->matrix,&local_54);
  return;
}

Assistant:

void prepare_coords() {
		if (has_uv) return;
		Vector3f v1, v2;
		o = Vector3f::ZERO;
		Vector3f norm = Vector3f::cross(v[0] - v[1], v[0] - v[2]).normalized();
		float C = Vector3f::dot(v[0], norm);
		if (fabs(norm[0]) > fabs(norm[1]) && fabs(norm[0])>fabs(norm[2])) o[0] = C / norm[0];
		else if (fabs(norm[1]) > fabs(norm[0])&&fabs(norm[1])>fabs(norm[2])) o[1] = C / norm[1];
		else o[2] = C / norm[2];
		createCoordinateSystem(norm, v1, v2);
		//norm,v1,v2 factorization
		matrix = Matrix3f(norm, v1, v2).inverse();
		/*
		cerr << norm[0] << "," << norm[1] << "," << norm[2] << " ";
		cerr << v1[0] << "," << v1[1] << "," << v1[2] << " ";
		cerr << v2[0] << "," << v2[1] << "," << v2[2] << " ";
		cerr << o[0] << " " << o[1] << " " << o[2] << "\n";*/
	}